

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

_Bool sparc_cpu_exec_interrupt(CPUState *cs,int interrupt_request)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  SPARCCPU_conflict1 *cpu;
  
  if ((interrupt_request & 2U) == 0) {
    return false;
  }
  iVar3 = cpu_interrupts_enabled((CPUSPARCState_conflict1 *)(cs[1].tb_jmp_cache + 0x1f5));
  if (((iVar3 == 0) || (uVar1 = *(uint *)(cs[1].tb_jmp_cache + 0x22b), (int)uVar1 < 1)) ||
     (((uVar1 & 0xf0) == 0x40 && ((uVar1 & 0xf) <= *(uint *)(cs[1].tb_jmp_cache + 0x22a))))) {
    _Var2 = false;
  }
  else {
    cs->exception_index = uVar1;
    sparc_cpu_do_interrupt_sparc64(cs);
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

static bool sparc_cpu_exec_interrupt(CPUState *cs, int interrupt_request)
{
    if (interrupt_request & CPU_INTERRUPT_HARD) {
        SPARCCPU *cpu = SPARC_CPU(cs);
        CPUSPARCState *env = &cpu->env;

        if (cpu_interrupts_enabled(env) && env->interrupt_index > 0) {
            int pil = env->interrupt_index & 0xf;
            int type = env->interrupt_index & 0xf0;

            if (type != TT_EXTINT || cpu_pil_allowed(env, pil)) {
                cs->exception_index = env->interrupt_index;
                sparc_cpu_do_interrupt(cs);
                return true;
            }
        }
    }
    return false;
}